

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDebugger.h
# Opt level: O2

int __thiscall
DebuggerTestHelper::bind(DebuggerTestHelper *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  Session *pSVar1;
  int extraout_EAX;
  shared_ptr<dap::ReaderWriter> server2client;
  shared_ptr<dap::ReaderWriter> client2server;
  undefined1 auStack_88 [16];
  __shared_ptr<dap::Reader,(__gnu_cxx::_Lock_policy)2> local_78 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<dap::ReaderWriter,_(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<dap::ReaderWriter,_(__gnu_cxx::_Lock_policy)2> local_58;
  _Any_data local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  
  dap::pipe((int *)&local_58);
  dap::pipe((int *)&local_68);
  pSVar1 = (this->Client)._M_t.
           super___uniq_ptr_impl<dap::Session,_std::default_delete<dap::Session>_>._M_t.
           super__Tuple_impl<0UL,_dap::Session_*,_std::default_delete<dap::Session>_>.
           super__Head_base<0UL,_dap::Session_*,_false>._M_head_impl;
  std::__shared_ptr<dap::Reader,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<dap::ReaderWriter,void>
            (local_78,&local_68);
  std::__shared_ptr<dap::Writer,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<dap::ReaderWriter,void>
            ((__shared_ptr<dap::Writer,(__gnu_cxx::_Lock_policy)2> *)auStack_88,&local_58);
  local_38 = 0;
  uStack_30 = 0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  dap::Session::bind(pSVar1,(int)local_78,(sockaddr *)auStack_88,(socklen_t)&local_48);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_88 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
  pSVar1 = (this->Debugger)._M_t.
           super___uniq_ptr_impl<dap::Session,_std::default_delete<dap::Session>_>._M_t.
           super__Tuple_impl<0UL,_dap::Session_*,_std::default_delete<dap::Session>_>.
           super__Head_base<0UL,_dap::Session_*,_false>._M_head_impl;
  std::__shared_ptr<dap::Reader,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<dap::ReaderWriter,void>
            (local_78,&local_58);
  std::__shared_ptr<dap::Writer,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<dap::ReaderWriter,void>
            ((__shared_ptr<dap::Writer,(__gnu_cxx::_Lock_policy)2> *)auStack_88,&local_68);
  local_38 = 0;
  uStack_30 = 0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  dap::Session::bind(pSVar1,(int)local_78,(sockaddr *)auStack_88,(socklen_t)&local_48);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_88 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  return extraout_EAX;
}

Assistant:

void bind()
  {
    auto client2server = dap::pipe();
    auto server2client = dap::pipe();
    Client->bind(server2client, client2server);
    Debugger->bind(client2server, server2client);
  }